

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * CreateObjectAllocation(ExpressionContext *ctx,SynBase *source,TypeBase *type)

{
  TypeBase *pTVar1;
  TypeBase *source_00;
  SynBase *ctx_00;
  bool bVar2;
  ExprIntegerLiteral *this;
  ExprFunctionCall *this_00;
  ExprTypeLiteral *this_01;
  ExprBase *node;
  ExpressionContext *this_02;
  TypeRef *type_00;
  InplaceStr local_50;
  ExpressionContext *local_40;
  ExprFunctionCall *alloc;
  ExprBase *typeId;
  ExprBase *size;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  size = (ExprBase *)type;
  type_local = (TypeBase *)source;
  source_local = (SynBase *)ctx;
  this = ExpressionContext::get<ExprIntegerLiteral>(ctx);
  ExprIntegerLiteral::ExprIntegerLiteral
            (this,(SynBase *)type_local,(TypeBase *)source_local[0x227].end,
             (longlong)size[1]._vptr_ExprBase);
  typeId = &this->super_ExprBase;
  this_00 = (ExprFunctionCall *)
            ExpressionContext::get<ExprTypeCast>((ExpressionContext *)source_local);
  source_00 = type_local;
  pTVar1 = (TypeBase *)source_local[0x227].end;
  this_01 = ExpressionContext::get<ExprTypeLiteral>((ExpressionContext *)source_local);
  ExprTypeLiteral::ExprTypeLiteral
            (this_01,(SynBase *)type_local,*(TypeBase **)&source_local[0x227].listed,
             (TypeBase *)size);
  ExprTypeCast::ExprTypeCast
            ((ExprTypeCast *)this_00,(SynBase *)source_00,pTVar1,&this_01->super_ExprBase,
             EXPR_CAST_REINTERPRET);
  ctx_00 = source_local;
  pTVar1 = type_local;
  alloc = this_00;
  InplaceStr::InplaceStr(&local_50,"__newS");
  node = CreateFunctionCall2((ExpressionContext *)ctx_00,(SynBase *)pTVar1,local_50,typeId,
                             &alloc->super_ExprBase,false,true,true);
  local_40 = (ExpressionContext *)getType<ExprFunctionCall>(node);
  bVar2 = isType<TypeError>((TypeBase *)size);
  if (bVar2) {
    ctx_local = local_40;
  }
  else {
    this_02 = (ExpressionContext *)
              ExpressionContext::get<ExprTypeCast>((ExpressionContext *)source_local);
    pTVar1 = type_local;
    type_00 = ExpressionContext::GetReferenceType
                        ((ExpressionContext *)source_local,(TypeBase *)size);
    ExprTypeCast::ExprTypeCast
              ((ExprTypeCast *)this_02,(SynBase *)pTVar1,&type_00->super_TypeBase,
               (ExprBase *)local_40,EXPR_CAST_REINTERPRET);
    ctx_local = this_02;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateObjectAllocation(ExpressionContext &ctx, SynBase *source, TypeBase *type)
{
	ExprBase *size = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, type->size);
	ExprBase *typeId = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeInt, new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, type), EXPR_CAST_REINTERPRET);

	ExprFunctionCall *alloc = getType<ExprFunctionCall>(CreateFunctionCall2(ctx, source, InplaceStr("__newS"), size, typeId, false, true, true));

	if(isType<TypeError>(type))
		return alloc;

	return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetReferenceType(type), alloc, EXPR_CAST_REINTERPRET);
}